

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionUtils.cpp
# Opt level: O2

Expression * __thiscall
ExpressionUtils::queueToExp
          (ExpressionUtils *this,
          queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *queueValOp)

{
  deque<Expression_*,_std::allocator<Expression_*>_> *this_00;
  _Elt_pointer pbVar1;
  bool bVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  Plus *this_01;
  ulong uVar5;
  Num *pNVar6;
  Neg *this_02;
  Var *pVVar7;
  _Map_pointer *__x;
  double dVar8;
  string local_108;
  string local_e8;
  undefined1 local_c8 [8];
  string front;
  stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_> expStack;
  Expression *neg;
  Expression *num;
  Expression *var;
  Expression *exp;
  
  exp = (Expression *)this;
  std::stack<Expression*,std::deque<Expression*,std::allocator<Expression*>>>::
  stack<std::deque<Expression*,std::allocator<Expression*>>,void>
            ((stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_> *)
             ((long)&front.field_2 + 8));
  do {
    pbVar1 = (queueValOp->c).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((queueValOp->c).
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == pbVar1) {
      if ((_Elt_pointer)
          expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_node ==
          expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur) {
        expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_node =
             (_Map_pointer)
             (expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_last[-1] + 0x40);
      }
      pEVar3 = (Expression *)
               ((Expression *)
               expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_node)[-1]._vptr_Expression;
      std::_Deque_base<Expression_*,_std::allocator<Expression_*>_>::~_Deque_base
                ((_Deque_base<Expression_*,_std::allocator<Expression_*>_> *)
                 ((long)&front.field_2 + 8));
      return pEVar3;
    }
    std::__cxx11::string::string((string *)local_c8,(string *)pbVar1);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&queueValOp->c);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c8,"+");
    if (bVar2) {
LAB_00108d8e:
      pEVar3 = (Expression *)
               expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
      if ((_Elt_pointer)
          expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_node ==
          expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur) {
        pEVar3 = expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_last[-1] + 0x40;
      }
      pEVar3 = (Expression *)pEVar3[-1]._vptr_Expression;
      this_00 = (deque<Expression_*,_std::allocator<Expression_*>_> *)((long)&front.field_2 + 8);
      std::deque<Expression_*,_std::allocator<Expression_*>_>::pop_back(this_00);
      pEVar4 = (Expression *)
               expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
      if ((_Elt_pointer)
          expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_node ==
          expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur) {
        pEVar4 = expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_last[-1] + 0x40;
      }
      pEVar4 = (Expression *)pEVar4[-1]._vptr_Expression;
      std::deque<Expression_*,_std::allocator<Expression_*>_>::pop_back(this_00);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c8,"+");
      if (bVar2) {
        this_01 = (Plus *)operator_new(0x18);
        Plus::Plus(this_01,pEVar4,pEVar3);
LAB_00108e9a:
        var = &this_01->super_Expression;
        std::vector<Expression_*,_std::allocator<Expression_*>_>::push_back
                  ((vector<Expression_*,_std::allocator<Expression_*>_> *)exp,&var);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c8,"-");
        if (bVar2) {
          this_01 = (Plus *)operator_new(0x18);
          Minus::Minus((Minus *)this_01,pEVar4,pEVar3);
          goto LAB_00108e9a;
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c8,"/");
        if (bVar2) {
          this_01 = (Plus *)operator_new(0x18);
          Div::Div((Div *)this_01,pEVar4,pEVar3);
          goto LAB_00108e9a;
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c8,"*");
        if (bVar2) {
          this_01 = (Plus *)operator_new(0x18);
          Mult::Mult((Mult *)this_01,pEVar4,pEVar3);
          goto LAB_00108e9a;
        }
      }
      std::deque<Expression_*,_std::allocator<Expression_*>_>::push_back
                ((deque<Expression_*,_std::allocator<Expression_*>_> *)((long)&front.field_2 + 8),
                 &var);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c8,"-");
      if (bVar2) goto LAB_00108d8e;
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c8,"*");
      if (bVar2) goto LAB_00108d8e;
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c8,"/");
      if (bVar2) goto LAB_00108d8e;
      if (*(char *)local_c8 == 0x2d) {
        uVar5 = std::__cxx11::string::find
                          ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_c8,0x2d);
        std::__cxx11::string::erase((ulong)local_c8,uVar5);
        if ((int)*(char *)local_c8 - 0x30U < 10) {
          pNVar6 = (Num *)operator_new(0x10);
          dVar8 = std::__cxx11::stod((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_c8,(size_t *)0x0);
          Num::Num(pNVar6,dVar8);
          neg = (Expression *)pNVar6;
          std::vector<Expression_*,_std::allocator<Expression_*>_>::push_back
                    ((vector<Expression_*,_std::allocator<Expression_*>_> *)exp,&neg);
          this_02 = (Neg *)operator_new(0x10);
          Neg::Neg(this_02,neg);
        }
        else {
          pVVar7 = (Var *)operator_new(0x28);
          std::__cxx11::string::string((string *)&local_108,(string *)local_c8);
          Var::Var(pVVar7,&local_108);
          num = (Expression *)pVVar7;
          std::__cxx11::string::~string((string *)&local_108);
          std::vector<Expression_*,_std::allocator<Expression_*>_>::push_back
                    ((vector<Expression_*,_std::allocator<Expression_*>_> *)exp,&num);
          this_02 = (Neg *)operator_new(0x10);
          Neg::Neg(this_02,num);
        }
        __x = &expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node;
        expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_node = (_Map_pointer)this_02;
        std::vector<Expression_*,_std::allocator<Expression_*>_>::push_back
                  ((vector<Expression_*,_std::allocator<Expression_*>_> *)exp,(value_type *)__x);
      }
      else if ((int)*(char *)local_c8 - 0x30U < 10) {
        pNVar6 = (Num *)operator_new(0x10);
        dVar8 = std::__cxx11::stod((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_c8,(size_t *)0x0);
        Num::Num(pNVar6,dVar8);
        __x = (_Map_pointer *)&neg;
        neg = (Expression *)pNVar6;
        std::vector<Expression_*,_std::allocator<Expression_*>_>::push_back
                  ((vector<Expression_*,_std::allocator<Expression_*>_> *)exp,(value_type *)__x);
      }
      else {
        pVVar7 = (Var *)operator_new(0x28);
        std::__cxx11::string::string((string *)&local_e8,(string *)local_c8);
        Var::Var(pVVar7,&local_e8);
        num = (Expression *)pVVar7;
        std::__cxx11::string::~string((string *)&local_e8);
        __x = (_Map_pointer *)&num;
        std::vector<Expression_*,_std::allocator<Expression_*>_>::push_back
                  ((vector<Expression_*,_std::allocator<Expression_*>_> *)exp,(value_type *)__x);
      }
      std::deque<Expression_*,_std::allocator<Expression_*>_>::push_back
                ((deque<Expression_*,_std::allocator<Expression_*>_> *)((long)&front.field_2 + 8),
                 (value_type *)__x);
    }
    std::__cxx11::string::~string((string *)local_c8);
  } while( true );
}

Assistant:

Expression *ExpressionUtils::queueToExp(queue<string> &queueValOp) {
    //all tokens in queue - convert to Expressions
    stack<Expression *> expStack;
    while (!queueValOp.empty()) {
        Expression *num;
        Expression *neg;
        Expression *var;
        //take number from front
        string front = queueValOp.front();
        queueValOp.pop();
        if (front == "+" || front == "-" || front == "*" || front == "/") {//operator
            Expression *secondNum = expStack.top();
            expStack.pop();
            Expression *firstNum = expStack.top();
            expStack.pop();

            Expression *exp;
            if (front == "+") {
                exp = new Plus(firstNum, secondNum);
                deathMap.push_back(exp);
            } else if (front == "-") {
                exp = new Minus(firstNum, secondNum);
                deathMap.push_back(exp);
            } else if (front == "/") {
                exp = new Div(firstNum, secondNum);
                deathMap.push_back(exp);
            } else if (front == "*") {
                exp = new Mult(firstNum, secondNum);
                deathMap.push_back(exp);
            }
            expStack.push(exp);
        } else if (front[0] == '-') {//neg num
            front.erase(front.find('-'), 1);
            if (isdigit(front[0])) {//num
                num = new Num(stod(front));
                deathMap.push_back(num);
                neg = new Neg(num);
                deathMap.push_back(neg);
                expStack.push(neg);
            } else { //var
                var = new Var(front);
                deathMap.push_back(var);
                neg = new Neg(var);
                deathMap.push_back(neg);
                expStack.push(neg);
            }
        } else if (isdigit(front[0])) {//num
            num = new Num(stod(front));
            deathMap.push_back(num);
            expStack.push(num);
        } else { //var
            var = new Var(front);
            deathMap.push_back(var);
            expStack.push(var);
        }
    }
    //only one (complex) expression left on stack
    return expStack.top();
}